

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O0

void __thiscall
BssSection_RoundTripForPopulated_Test::~BssSection_RoundTripForPopulated_Test
          (BssSection_RoundTripForPopulated_Test *this)

{
  BssSection_RoundTripForPopulated_Test *this_local;
  
  ~BssSection_RoundTripForPopulated_Test(this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (BssSection, RoundTripForPopulated) {
    constexpr auto kind = pstore::repo::section_kind::bss;
    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::bss_section>::value,
                   "Expected bss to map to bss_section");

    pstore::exchange::export_ns::string_mapping exported_names{
        export_db_, pstore::exchange::export_ns::name_index_tag ()};

    pstore::repo::section_content exported_content{kind};
    exported_content.align = 32U;
    exported_content.data.resize (7);

    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, false);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    pstore::exchange::import_ns::string_mapping imported_names;

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a BSS section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer =
        pstore::exchange::import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ()
                                       << ' ' << parser.coordinate () << '\n'
                                       << exported_json;

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (imported_content.kind, exported_content.kind);
    EXPECT_EQ (imported_content.align, exported_content.align);
    EXPECT_THAT (imported_content.data, testing::ContainerEq (exported_content.data));
    EXPECT_TRUE (imported_content.ifixups.empty ());
    EXPECT_TRUE (imported_content.xfixups.empty ());
}